

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

Pipeline * __thiscall Pipeline::getNext(Pipeline *this,bool allow_null)

{
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_11;
  Pipeline *pPStack_10;
  bool allow_null_local;
  Pipeline *this_local;
  
  if ((this->next_ == (Pipeline *)0x0) && (!allow_null)) {
    local_11 = allow_null;
    pPStack_10 = this;
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_38,&this->identifier,
                   ": Pipeline::getNext() called on pipeline with no next");
    std::logic_error::logic_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this->next_;
}

Assistant:

Pipeline*
Pipeline::getNext(bool allow_null)
{
    if (!next_ && !allow_null) {
        throw std::logic_error(
            this->identifier + ": Pipeline::getNext() called on pipeline with no next");
    }
    return next_;
}